

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O0

void * uo_cb_stack_pop(uo_cb *cb)

{
  void *pvVar1;
  uo_cb *cb_local;
  
  pvVar1 = uo_stack_pop(&cb->stack);
  return pvVar1;
}

Assistant:

inline void *uo_cb_stack_pop(
    uo_cb *cb)
{
    return uo_stack_pop(&cb->stack);
}